

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::
resizeHelper<false,unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  iterator end_00;
  unsigned_long *begin_01;
  pointer data;
  size_t sVar1;
  runtime_error *prVar2;
  ulong uVar3;
  ulong uVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  size_t x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> view2;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> viewT;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_178;
  iterator iStack_170;
  unsigned_long *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  byte *local_130;
  unsigned_long *local_128;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> local_b0;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] == (Marray<unsigned_char,std::allocator<unsigned_long>>)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Assertion failed.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_178._M_current = (unsigned_long *)0x0;
  iStack_170._M_current = (unsigned_long *)0x0;
  local_168 = (unsigned_long *)0x0;
  uVar4 = 1;
  local_130 = value;
  local_128 = begin;
  if (begin != end) {
    do {
      local_120.data_ = (pointer)*begin;
      if (local_120.data_ == (pointer)0x0) goto LAB_00106bdc;
      if (iStack_170._M_current == local_168) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_178,iStack_170,
                   (unsigned_long *)&local_120);
      }
      else {
        *iStack_170._M_current = (unsigned_long)local_120.data_;
        iStack_170._M_current = iStack_170._M_current + 1;
      }
      uVar4 = uVar4 * (long)local_120.data_;
      begin = begin + 1;
    } while (begin != end);
  }
  if ((long)uVar4 < 0) {
    std::__throw_bad_alloc();
LAB_00106bdc:
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Assertion failed.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  data = (pointer)operator_new(uVar4);
  begin_01 = local_128;
  if (uVar4 != 0) {
    memset(data,(uint)*local_130,uVar4);
  }
  if (*(uchar **)this != (uchar *)0x0) {
    if ((uVar4 != 1) && (*(size_type *)(this + 0x28) != 0)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_c8,*(size_type *)(this + 0x28),(allocator_type *)&local_120);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_e0,(long)iStack_170._M_current - (long)local_178._M_current >> 3,
                 (allocator_type *)&local_120);
      if (*(long *)this == 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Assertion failed.");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_120.data_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_148,*(size_type *)(this + 0x28),(value_type_conflict *)&local_120,
                 (allocator_type *)local_70);
      local_120.data_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_160,(long)iStack_170._M_current - (long)local_178._M_current >> 3,
                 (value_type_conflict *)&local_120,(allocator_type *)local_70);
      if (*(long *)this != 0) {
        uVar4 = 0;
        do {
          uVar3 = (long)iStack_170._M_current - (long)local_178._M_current >> 3;
          if (*(ulong *)(this + 0x28) <= uVar3) {
            uVar3 = *(ulong *)(this + 0x28);
          }
          if (uVar3 <= uVar4) {
            local_120.data_ = (pointer)0x0;
            local_120.geometry_.shape_ = (size_t *)0x0;
            local_120.geometry_.shapeStrides_ = (size_t *)0x0;
            local_120.geometry_.strides_ = (size_t *)0x0;
            local_120.geometry_.dimension_ = 0;
            local_120.geometry_.size_ = 0;
            local_120.geometry_.coordinateOrder_ = LastMajorOrder;
            local_120.geometry_.isSimple_ = true;
            View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_120);
            View<unsigned_char,false,std::allocator<unsigned_long>>::
            constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_120);
            end_00._M_current = iStack_170._M_current;
            begin_00._M_current = local_178._M_current;
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
            local_70._0_8_ = data;
            marray_detail::Geometry<std::allocator<unsigned_long>>::
            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),begin_00,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )end_00._M_current,(CoordinateOrder *)(this + 0x38),
                       (CoordinateOrder *)(this + 0x38),(allocator_type *)&local_b0);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
            local_b0.data_ = (pointer)0x0;
            local_b0.geometry_.shape_ = (size_t *)0x0;
            local_b0.geometry_.shapeStrides_ = (size_t *)0x0;
            local_b0.geometry_.strides_ = (size_t *)0x0;
            local_b0.geometry_.dimension_ = 0;
            local_b0.geometry_.size_ = 0;
            local_b0.geometry_.coordinateOrder_ = LastMajorOrder;
            local_b0.geometry_.isSimple_ = true;
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            View<unsigned_char,false,std::allocator<unsigned_long>>::
            view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_70,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,&local_b0);
            View<unsigned_char,_true,_std::allocator<unsigned_long>_>::squeeze(&local_120);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::squeeze(&local_b0);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            marray_detail::
            AssignmentOperatorHelper<false,_unsigned_char,_unsigned_char,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::execute(&local_120,&local_b0);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_b0);
            operator_delete(local_b0.geometry_.shape_,local_b0.geometry_.dimension_ * 0x18);
            operator_delete(local_60,local_48 * 0x18);
            operator_delete(local_120.geometry_.shape_,local_120.geometry_.dimension_ * 0x18);
            if (local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_160.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_160.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_160.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_148.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00106b68;
          }
          sVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,
                             uVar4);
          if (local_178._M_current[uVar4] < sVar1) {
            sVar1 = local_178._M_current[uVar4];
          }
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] = sVar1;
          local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] = sVar1;
          uVar4 = uVar4 + 1;
        } while (*(long *)this != 0);
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"Assertion failed.");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *data = **(uchar **)this;
LAB_00106b68:
    operator_delete(*(void **)this,*(ulong *)(this + 0x30));
    *(undefined8 *)this = 0;
  }
  View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
            ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin_01,end,data,
             (CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
             (allocator_type *)&local_120);
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<unsigned_char,std::allocator<unsigned_long>>)0x0) {
    if (local_178._M_current != (unsigned_long *)0x0) {
      operator_delete(local_178._M_current,(long)local_168 - (long)local_178._M_current);
    }
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Assertion failed.");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}